

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_adaptor.hpp
# Opt level: O1

void __thiscall
io::basic_adaptor<io::basic_string_stream<char,std::char_traits<char>>>::
basic_adaptor<char_const(&)[12],void>
          (basic_adaptor<io::basic_string_stream<char,std::char_traits<char>>> *this,
          char (*args) [12])

{
  size_t sVar1;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  undefined8 uStack_28;
  
  local_40 = &local_30;
  sVar1 = strlen(*args);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,args,*args + sVar1);
  *(undefined8 *)this = 0;
  *(basic_adaptor<io::basic_string_stream<char,std::char_traits<char>>> **)(this + 8) = this + 0x18;
  if (local_40 == &local_30) {
    *(ulong *)(this + 0x18) = CONCAT71(uStack_2f,local_30);
    *(undefined8 *)(this + 0x20) = uStack_28;
  }
  else {
    *(undefined1 **)(this + 8) = local_40;
    *(ulong *)(this + 0x18) = CONCAT71(uStack_2f,local_30);
  }
  *(undefined8 *)(this + 0x10) = local_38;
  return;
}

Assistant:

basic_adaptor(Args&&... args)
            : stream_(std::forward<Args>(args)...)
    {}